

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

TestCaseGroup * vkt::SpirVAssembly::createModuleTests(TestContext *testCtx)

{
  char *__rhs;
  char *__rhs_00;
  char *__rhs_01;
  char *__rhs_02;
  char *__rhs_03;
  int iVar1;
  ShaderPermutation SVar2;
  TestCaseGroup *pTVar3;
  undefined3 extraout_var;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *testCodeFragments;
  undefined4 uVar4;
  long lVar5;
  InstanceContext *__return_storage_ptr__;
  InstanceContext *arg0;
  ulong uVar6;
  allocator<char> local_85a;
  allocator<char> local_859;
  allocator<char> local_858;
  allocator<char> local_857;
  allocator<char> local_856;
  allocator<char> local_855;
  allocator<char> local_854;
  allocator<char> local_853;
  allocator<char> local_852;
  allocator<char> local_851;
  TestCaseGroup *local_850;
  undefined1 local_848 [32];
  _Base_ptr local_828;
  size_t local_820;
  undefined4 local_80c;
  string local_808;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> moduleTests;
  string name;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  RGBA defaultColors [4];
  int local_6c8;
  RGBA invertedColors [4];
  string local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  string local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  ShaderElement local_5c8 [4];
  ShaderElement local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  ShaderElement local_438 [4];
  ShaderElement local_318;
  InstanceContext local_2d0;
  InstanceContext local_1f0;
  InstanceContext local_110;
  
  defaultColors[0].m_value = 0;
  defaultColors[1].m_value = 0;
  defaultColors[2].m_value = 0;
  defaultColors[3].m_value = 0;
  invertedColors[0].m_value = 0;
  invertedColors[1].m_value = 0;
  invertedColors[2].m_value = 0;
  invertedColors[3].m_value = 0;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar3,testCtx,"module","Multiple entry points into shaders");
  moduleTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = pTVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_5c8,"module",(allocator<char> *)&local_668);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_848,"main",(allocator<char> *)&local_688);
  ShaderElement::ShaderElement
            (local_438,&local_5c8[0].moduleName,(string *)local_848,VK_SHADER_STAGE_VERTEX_BIT);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"module",(allocator<char> *)&local_5e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_808,"main",(allocator<char> *)&local_608);
  ShaderElement::ShaderElement(local_438 + 1,&name,&local_808,VK_SHADER_STAGE_GEOMETRY_BIT);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_708,"module",(allocator<char> *)&local_628);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,"main",(allocator<char> *)&local_458);
  ShaderElement::ShaderElement
            (local_438 + 2,&local_708,&local_768,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"module",(allocator<char> *)&local_648);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"main",&local_858);
  ShaderElement::ShaderElement
            (local_438 + 3,&local_728,&local_748,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,"module",&local_859);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"main",&local_85a);
  testCodeFragments =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)0x10;
  ShaderElement::ShaderElement(&local_318,&local_788,&local_7a8,VK_SHADER_STAGE_FRAGMENT_BIT);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)local_848);
  std::__cxx11::string::~string((string *)local_5c8);
  getDefaultColors(&defaultColors);
  getInvertedDefaultColors(&invertedColors);
  pTVar3 = moduleTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_848,"same_module",(allocator<char> *)&local_808);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"",(allocator<char> *)&local_708);
  local_5c8[0].moduleName.field_2._8_8_ = &local_5c8[0].moduleName._M_string_length;
  local_5c8[0].moduleName._M_dataplus._M_p = (pointer)0x0;
  local_5c8[0].moduleName._M_string_length = 0;
  local_5c8[0].moduleName.field_2._M_allocated_capacity = 0;
  local_5c8[0].entryName._M_string_length = 0;
  local_5c8[0].entryName._M_dataplus._M_p = (pointer)local_5c8[0].moduleName.field_2._8_8_;
  createInstanceContext<5ul>
            (&local_2d0,(SpirVAssembly *)local_438,(ShaderElement_0_ *)local_5c8,testCodeFragments);
  arg0 = &local_2d0;
  addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
            (pTVar3,(string *)local_848,&name,createCombinedModule,runAndVerifyDefaultPipeline,arg0)
  ;
  InstanceContext::~InstanceContext(&local_2d0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_5c8);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)local_848);
  uVar4 = 0;
  while( true ) {
    pTVar3 = moduleTests.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
    if ((deUint8)uVar4 == ' ') break;
    SVar2 = getShaderPermutation((deUint8)uVar4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7a8,"vert",(allocator<char> *)&local_668);
    __rhs = *(char **)(&DAT_00bfe370 + ((ulong)(uint5)SVar2 & 0xff) * 8);
    local_850 = (TestCaseGroup *)CONCAT35(extraout_var,SVar2);
    std::operator+(&local_788,&local_7a8,__rhs);
    std::operator+(&local_748,&local_788,"_geom");
    uVar6 = (ulong)local_850 & 0xffffffffff;
    __rhs_00 = *(char **)(&DAT_00bfe370 + (uVar6 >> 8 & 0xff) * 8);
    std::operator+(&local_728,&local_748,__rhs_00);
    std::operator+(&local_768,&local_728,"_tessc");
    __rhs_01 = *(char **)(&DAT_00bfe370 + (uVar6 >> 0x10 & 0xff) * 8);
    std::operator+(&local_708,&local_768,__rhs_01);
    local_80c = uVar4;
    std::operator+(&local_808,&local_708,"_tesse");
    __rhs_02 = *(char **)(&DAT_00bfe370 + (uVar6 >> 0x18 & 0xff) * 8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_848,
                   &local_808,__rhs_02);
    std::operator+(&local_5c8[0].moduleName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_848,
                   "_frag");
    __rhs_03 = *(char **)(&DAT_00bfe370 + (uVar6 >> 0x20) * 8);
    std::operator+(&name,&local_5c8[0].moduleName,__rhs_03);
    std::__cxx11::string::~string((string *)local_5c8);
    std::__cxx11::string::~string((string *)local_848);
    std::__cxx11::string::~string((string *)&local_808);
    std::__cxx11::string::~string((string *)&local_708);
    std::__cxx11::string::~string((string *)&local_768);
    std::__cxx11::string::~string((string *)&local_728);
    std::__cxx11::string::~string((string *)&local_748);
    std::__cxx11::string::~string((string *)&local_788);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_848,"vert",&local_858);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"vert",&local_859);
    std::operator+(&local_808,&local_708,__rhs);
    ShaderElement::ShaderElement
              (local_5c8,(string *)local_848,&local_808,VK_SHADER_STAGE_VERTEX_BIT);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_768,"geom",&local_85a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"geom",&local_851);
    std::operator+(&local_728,&local_748,__rhs_00);
    ShaderElement::ShaderElement(local_5c8 + 1,&local_768,&local_728,VK_SHADER_STAGE_GEOMETRY_BIT);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,"tessc",&local_852);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"tessc",&local_853);
    std::operator+(&local_7a8,&local_668,__rhs_01);
    ShaderElement::ShaderElement
              (local_5c8 + 2,&local_788,&local_7a8,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"tesse",&local_854);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"tesse",&local_855);
    std::operator+(&local_5e8,&local_608,__rhs_02);
    ShaderElement::ShaderElement
              (local_5c8 + 3,&local_688,&local_5e8,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"frag",&local_856);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"frag",&local_857);
    std::operator+(&local_458,&local_648,__rhs_03);
    ShaderElement::ShaderElement(&local_4a8,&local_628,&local_458,VK_SHADER_STAGE_FRAGMENT_BIT);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_648);
    std::__cxx11::string::~string((string *)&local_628);
    std::__cxx11::string::~string((string *)&local_5e8);
    std::__cxx11::string::~string((string *)&local_608);
    std::__cxx11::string::~string((string *)&local_688);
    std::__cxx11::string::~string((string *)&local_7a8);
    std::__cxx11::string::~string((string *)&local_668);
    std::__cxx11::string::~string((string *)&local_788);
    std::__cxx11::string::~string((string *)&local_728);
    std::__cxx11::string::~string((string *)&local_748);
    std::__cxx11::string::~string((string *)&local_768);
    std::__cxx11::string::~string((string *)&local_808);
    std::__cxx11::string::~string((string *)&local_708);
    std::__cxx11::string::~string((string *)local_848);
    iVar1 = (int)(uVar6 >> 8) + (int)local_850;
    local_6c8 = (int)(uVar6 >> 0x10);
    local_850 = moduleTests.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .ptr;
    if (((int)(uVar6 >> 0x18) + local_6c8 + iVar1 + (int)(uVar6 >> 0x20) & 1U) == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_808,"",(allocator<char> *)&local_708);
      __return_storage_ptr__ = &local_110;
      local_848._0_8_ = (pointer)0x0;
      local_848._8_8_ = 0;
      local_848._16_8_ = 0;
      local_848._24_8_ = local_848 + 8;
      local_820 = 0;
      local_828 = (_Base_ptr)local_848._24_8_;
      createInstanceContext<5ul>
                (__return_storage_ptr__,(SpirVAssembly *)local_5c8,(ShaderElement_0_ *)defaultColors
                 ,&defaultColors,(RGBA (*) [4])local_848,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)arg0);
      arg0 = __return_storage_ptr__;
      addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
                (local_850,&name,&local_808,createMultipleEntries,runAndVerifyDefaultPipeline,
                 __return_storage_ptr__);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_808,"",(allocator<char> *)&local_708);
      __return_storage_ptr__ = &local_1f0;
      local_848._0_8_ = (pointer)0x0;
      local_848._8_8_ = 0;
      local_848._16_8_ = 0;
      local_848._24_8_ = local_848 + 8;
      local_820 = 0;
      local_828 = (_Base_ptr)local_848._24_8_;
      createInstanceContext<5ul>
                (__return_storage_ptr__,(SpirVAssembly *)local_5c8,(ShaderElement_0_ *)defaultColors
                 ,&invertedColors,(RGBA (*) [4])local_848,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)arg0);
      arg0 = __return_storage_ptr__;
      addFunctionCaseWithPrograms<vkt::SpirVAssembly::InstanceContext>
                (local_850,&name,&local_808,createMultipleEntries,runAndVerifyDefaultPipeline,
                 __return_storage_ptr__);
    }
    InstanceContext::~InstanceContext(__return_storage_ptr__);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_848);
    std::__cxx11::string::~string((string *)&local_808);
    lVar5 = 0x120;
    do {
      ShaderElement::~ShaderElement
                ((ShaderElement *)((long)&local_5c8[0].moduleName._M_dataplus._M_p + lVar5));
      lVar5 = lVar5 + -0x48;
    } while (lVar5 != -0x48);
    std::__cxx11::string::~string((string *)&name);
    uVar4 = CONCAT31((int3)((uint)local_80c >> 8),(char)local_80c + '\x01');
  }
  moduleTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  lVar5 = 0x120;
  do {
    ShaderElement::~ShaderElement
              ((ShaderElement *)((long)&local_438[0].moduleName._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x48;
  } while (lVar5 != -0x48);
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&moduleTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar3;
}

Assistant:

tcu::TestCaseGroup* createModuleTests(tcu::TestContext& testCtx)
{
	RGBA								defaultColors[4];
	RGBA								invertedColors[4];
	de::MovePtr<tcu::TestCaseGroup>		moduleTests			(new tcu::TestCaseGroup(testCtx, "module", "Multiple entry points into shaders"));

	const ShaderElement					combinedPipeline[]	=
	{
		ShaderElement("module", "main", VK_SHADER_STAGE_VERTEX_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_GEOMETRY_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT),
		ShaderElement("module", "main", VK_SHADER_STAGE_FRAGMENT_BIT)
	};

	getDefaultColors(defaultColors);
	getInvertedDefaultColors(invertedColors);
	addFunctionCaseWithPrograms<InstanceContext>(moduleTests.get(), "same_module", "", createCombinedModule, runAndVerifyDefaultPipeline, createInstanceContext(combinedPipeline, map<string, string>()));

	const char* numbers[] =
	{
		"1", "2"
	};

	for (deInt8 idx = 0; idx < 32; ++idx)
	{
		ShaderPermutation			permutation		= getShaderPermutation(idx);
		string						name			= string("vert") + numbers[permutation.vertexPermutation] + "_geom" + numbers[permutation.geometryPermutation] + "_tessc" + numbers[permutation.tesscPermutation] + "_tesse" + numbers[permutation.tessePermutation] + "_frag" + numbers[permutation.fragmentPermutation];
		const ShaderElement			pipeline[]		=
		{
			ShaderElement("vert",	string("vert") +	numbers[permutation.vertexPermutation],		VK_SHADER_STAGE_VERTEX_BIT),
			ShaderElement("geom",	string("geom") +	numbers[permutation.geometryPermutation],	VK_SHADER_STAGE_GEOMETRY_BIT),
			ShaderElement("tessc",	string("tessc") +	numbers[permutation.tesscPermutation],		VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT),
			ShaderElement("tesse",	string("tesse") +	numbers[permutation.tessePermutation],		VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT),
			ShaderElement("frag",	string("frag") +	numbers[permutation.fragmentPermutation],	VK_SHADER_STAGE_FRAGMENT_BIT)
		};

		// If there are an even number of swaps, then it should be no-op.
		// If there are an odd number, the color should be flipped.
		if ((permutation.vertexPermutation + permutation.geometryPermutation + permutation.tesscPermutation + permutation.tessePermutation + permutation.fragmentPermutation) % 2 == 0)
		{
			addFunctionCaseWithPrograms<InstanceContext>(moduleTests.get(), name, "", createMultipleEntries, runAndVerifyDefaultPipeline, createInstanceContext(pipeline, defaultColors, defaultColors, map<string, string>()));
		}
		else
		{
			addFunctionCaseWithPrograms<InstanceContext>(moduleTests.get(), name, "", createMultipleEntries, runAndVerifyDefaultPipeline, createInstanceContext(pipeline, defaultColors, invertedColors, map<string, string>()));
		}
	}
	return moduleTests.release();
}